

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

LoopStatementSyntax * __thiscall
slang::parsing::Parser::parseLoopStatement(Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token repeatOrWhile;
  string_view syntaxName;
  Token prevToken;
  StatementSyntax *label_00;
  LoopStatementSyntax *pLVar1;
  undefined8 in_RSI;
  Parser *in_RDI;
  Token TVar2;
  Token closeParen_00;
  Token openParen_00;
  StatementSyntax *statement;
  Token closeParen;
  ExpressionSyntax *expr;
  Token openParen;
  Token keyword;
  undefined1 in_stack_000009f6;
  undefined1 in_stack_000009f7;
  Parser *in_stack_000009f8;
  size_t in_stack_fffffffffffffeb8;
  Parser *in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffec8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffed0;
  ParserBase *in_stack_fffffffffffffee0;
  SyntaxFactory *this_00;
  SyntaxNode *in_stack_fffffffffffffee8;
  StatementSyntax *pSVar3;
  char *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  Info *in_stack_ffffffffffffff10;
  TokenKind in_stack_ffffffffffffff4e;
  ParserBase *in_stack_ffffffffffffff50;
  ExpressionSyntax *local_60;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_58;
  StatementSyntax *local_38;
  
  TVar2 = ParserBase::consume(in_stack_fffffffffffffee0);
  closeParen_00 = ParserBase::expect(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4e);
  parseExpression(in_stack_fffffffffffffec0);
  openParen_00 = ParserBase::expect(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4e);
  label_00 = parseStatement(in_stack_000009f8,(bool)in_stack_000009f7,(bool)in_stack_000009f6);
  local_60 = openParen_00._0_8_;
  local_58 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)openParen_00.info;
  local_38._0_2_ = TVar2.kind;
  pSVar3 = label_00;
  if ((TokenKind)local_38 == WhileKeyword) {
    sv((char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    sv((char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  prevToken.info = in_stack_ffffffffffffff10;
  prevToken.kind = (short)in_stack_ffffffffffffff08;
  prevToken._2_1_ = (char)((ulong)in_stack_ffffffffffffff08 >> 0x10);
  prevToken.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff08 >> 0x18);
  prevToken.rawLen = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  syntaxName._M_str = in_stack_ffffffffffffff00;
  syntaxName._M_len = (size_t)pSVar3;
  checkEmptyBody(in_RDI,in_stack_fffffffffffffee8,prevToken,syntaxName);
  this_00 = &in_RDI->factory;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffed0._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffec8;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffec0,
             elements);
  local_38 = TVar2._0_8_;
  repeatOrWhile.info = (Info *)in_RDI;
  repeatOrWhile.kind = (short)in_RSI;
  repeatOrWhile._2_1_ = (char)((ulong)in_RSI >> 0x10);
  repeatOrWhile.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  repeatOrWhile.rawLen = (int)((ulong)in_RSI >> 0x20);
  pLVar1 = slang::syntax::SyntaxFactory::loopStatement
                     (this_00,(NamedLabelSyntax *)label_00,local_58,repeatOrWhile,openParen_00,
                      local_60,closeParen_00,local_38);
  return pLVar1;
}

Assistant:

LoopStatementSyntax& Parser::parseLoopStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& statement = parseStatement();
    checkEmptyBody(statement, closeParen,
                   keyword.kind == TokenKind::WhileKeyword ? "while loop"sv : "repeat loop"sv);
    return factory.loopStatement(label, attributes, keyword, openParen, expr, closeParen,
                                 statement);
}